

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ic.c
# Opt level: O3

int IDACalcIC(void *ida_mem,int icopt,sunrealtype tout1)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  undefined8 *puVar14;
  undefined8 uVar15;
  int iVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  char *msgfmt;
  ulong uVar19;
  double dVar20;
  sunrealtype sVar21;
  ulong uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int local_9c;
  double local_98;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar16 = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar8 = -0x14;
    iVar7 = 0x73;
  }
  else if (*(int *)((long)ida_mem + 0x3d0) == 0) {
    msgfmt = "Attempt to call before IDAMalloc.";
    iVar16 = -0x17;
    iVar8 = -0x17;
    iVar7 = 0x7e;
  }
  else {
    iVar7 = IDAInitialSetup((IDAMem)ida_mem);
    iVar16 = -0x16;
    if (iVar7 != 0) {
      return -0x16;
    }
    *(undefined4 *)((long)ida_mem + 0x3c0) = 1;
    if (icopt - 3U < 0xfffffffe) {
      msgfmt = "icopt has an illegal value.";
      iVar8 = -0x16;
      iVar7 = 0x92;
    }
    else {
      *(int *)((long)ida_mem + 0x220) = icopt;
      if ((icopt == 1) && (*(long *)((long)ida_mem + 0x1b0) == 0)) {
        msgfmt = "id = NULL conflicts with icopt.";
        iVar8 = -0x16;
        iVar7 = 0x9b;
      }
      else {
        dVar27 = ABS(tout1 - *(double *)((long)ida_mem + 0x2a8));
        if ((ABS(tout1) + ABS(*(double *)((long)ida_mem + 0x2a8))) *
            (*(double *)((long)ida_mem + 8) + *(double *)((long)ida_mem + 8)) <= dVar27) {
          uVar13 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1c8));
          *(undefined8 *)((long)ida_mem + 0x210) = uVar13;
          uVar13 = N_VClone(*(undefined8 *)((long)ida_mem + 0x1c8));
          *(undefined8 *)((long)ida_mem + 0x218) = uVar13;
          *(undefined8 *)((long)ida_mem + 0x208) = *(undefined8 *)((long)ida_mem + 0x2a8);
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x60),
                   *(undefined8 *)((long)ida_mem + 0x210));
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x68),
                   *(undefined8 *)((long)ida_mem + 0x218));
          *(undefined4 *)((long)ida_mem + 0x238) = 1;
          *(double *)((long)ida_mem + 0x250) = dVar27;
          if (icopt == 1) {
            dVar20 = (double)N_VMin(*(undefined8 *)((long)ida_mem + 0x1b0));
            if (dVar20 < 0.0) {
              msgfmt = "id has illegal values.";
              iVar16 = -0x16;
              iVar8 = -0x16;
              iVar7 = 0xbd;
              goto LAB_0010f97a;
            }
            if (0.5 < dVar20) {
              *(undefined4 *)((long)ida_mem + 0x238) = 0;
            }
          }
          *(undefined8 *)((long)ida_mem + 0x2e8) = *(undefined8 *)((long)ida_mem + 0x240);
          *(undefined8 *)((long)ida_mem + 0x2d0) = 0x3ff0000000000000;
          *(undefined4 *)((long)ida_mem + 0x234) = 0;
          sVar21 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x218),
                               *(N_Vector *)((long)ida_mem + 0x180),*(int *)((long)ida_mem + 0x5c));
          uVar19 = -(ulong)(0.5 / (dVar27 * 0.001) < sVar21);
          uVar22 = ~uVar19 & (ulong)(dVar27 * 0.001) | (ulong)(0.5 / sVar21) & uVar19;
          uVar19 = -(ulong)(tout1 < *(double *)((long)ida_mem + 0x2a8));
          local_98 = (double)(uVar19 & (uVar22 ^ 0x8000000000000000) | ~uVar19 & uVar22);
          *(double *)((long)ida_mem + 0x290) = local_98;
          iVar16 = 1;
          dVar27 = 0.0;
          iVar7 = 1;
          if (icopt == 1) {
            dVar27 = 1.0 / local_98;
            iVar7 = *(int *)((long)ida_mem + 0x228);
          }
          *(double *)((long)ida_mem + 0x2b8) = dVar27;
          do {
            if (0 < iVar7) {
              local_9c = 1;
              do {
                uVar13 = *(undefined8 *)((long)ida_mem + 0x1c8);
                uVar2 = *(undefined8 *)((long)ida_mem + 0x1d8);
                uVar3 = *(undefined8 *)((long)ida_mem + 0x70);
                iVar8 = (**(code **)((long)ida_mem + 0x10))
                                  (*(undefined8 *)((long)ida_mem + 0x208),
                                   *(undefined8 *)((long)ida_mem + 0x210),
                                   *(undefined8 *)((long)ida_mem + 0x218),
                                   *(undefined8 *)((long)ida_mem + 0x1a8),
                                   *(undefined8 *)((long)ida_mem + 0x18));
                *(long *)((long)ida_mem + 0x368) = *(long *)((long)ida_mem + 0x368) + 1;
                iVar9 = -8;
                if (iVar8 < 0) {
LAB_0011040f:
                  *(long *)((long)ida_mem + 0x370) = *(long *)((long)ida_mem + 0x370) + 1;
                  goto LAB_00110416;
                }
                if (iVar8 != 0) {
                  iVar9 = -0xc;
                  goto LAB_0011040f;
                }
                N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1a8),
                         *(undefined8 *)((long)ida_mem + 0x1c0));
                if (*(int *)((long)ida_mem + 0x22c) < 1) break;
                iVar8 = 1;
                do {
                  if (*(code **)((long)ida_mem + 0x3f8) != (code *)0x0) {
                    *(long *)((long)ida_mem + 0x390) = *(long *)((long)ida_mem + 0x390) + 1;
                    iVar9 = (**(code **)((long)ida_mem + 0x3f8))
                                      (ida_mem,*(undefined8 *)((long)ida_mem + 0x210),
                                       *(undefined8 *)((long)ida_mem + 0x218),
                                       *(undefined8 *)((long)ida_mem + 0x1a8),uVar13,uVar2,uVar3);
                    if (iVar9 < 0) {
                      iVar9 = -6;
                      goto LAB_0011040f;
                    }
                    if (iVar9 == 0) goto LAB_0010fd10;
                    iVar9 = 1;
LAB_00110305:
                    bVar6 = false;
                    break;
                  }
LAB_0010fd10:
                  *(undefined8 *)((long)ida_mem + 0x1f8) = *(undefined8 *)((long)ida_mem + 0x70);
                  iVar10 = (**(code **)((long)ida_mem + 0x400))
                                     (ida_mem,*(undefined8 *)((long)ida_mem + 0x1a8),
                                      *(undefined8 *)((long)ida_mem + 0x180),
                                      *(undefined8 *)((long)ida_mem + 0x210),
                                      *(undefined8 *)((long)ida_mem + 0x218),
                                      *(undefined8 *)((long)ida_mem + 0x1c0));
                  if (iVar10 < 0) {
LAB_00110403:
                    iVar9 = -7;
                    goto LAB_0011040f;
                  }
                  iVar9 = 1;
                  if (iVar10 != 0) goto LAB_00110305;
                  sVar21 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x1a8),
                                       *(N_Vector *)((long)ida_mem + 0x180),0);
                  if (*(int *)((long)ida_mem + 0x238) == 0) {
                    sVar21 = sVar21 * ABS(*(double *)((long)ida_mem + 0x2b8)) *
                                      *(double *)((long)ida_mem + 0x250);
                  }
                  if (sVar21 <= *(double *)((long)ida_mem + 0x2e8)) goto LAB_001103a7;
                  if (0 < *(int *)((long)ida_mem + 0x230)) {
                    iVar10 = 0;
                    dVar27 = sVar21;
                    do {
                      dVar23 = dVar27;
                      *(long *)((long)ida_mem + 0x380) = *(long *)((long)ida_mem + 0x380) + 1;
                      uVar4 = *(undefined8 *)((long)ida_mem + 0x1c8);
                      *(undefined8 *)((long)ida_mem + 0x200) = *(undefined8 *)((long)ida_mem + 0x78)
                      ;
                      uVar15 = *(undefined8 *)((long)ida_mem + 0x1d8);
                      *(undefined8 *)((long)ida_mem + 0x1e8) = uVar15;
                      *(undefined8 *)((long)ida_mem + 0x1f0) = uVar4;
                      dVar24 = dVar23 * dVar23 * 0.5;
                      dVar25 = 1.0;
                      dVar20 = dVar23;
                      if (*(int *)((long)ida_mem + 0x58) != 0) {
                        uVar17 = *(undefined8 *)((long)ida_mem + 0x1a8);
                        if (*(int *)((long)ida_mem + 0x220) == 1) {
                          N_VProd(*(undefined8 *)((long)ida_mem + 0x1b0),uVar17);
                          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                                       *(undefined8 *)((long)ida_mem + 0x1a8),
                                       *(undefined8 *)((long)ida_mem + 0x200));
                          uVar18 = *(undefined8 *)((long)ida_mem + 0x210);
                          uVar15 = *(undefined8 *)((long)ida_mem + 0x1e8);
                          uVar17 = *(undefined8 *)((long)ida_mem + 0x200);
                        }
                        else {
                          uVar18 = *(undefined8 *)((long)ida_mem + 0x210);
                        }
                        N_VLinearSum(0x3ff0000000000000,uVar18,uVar17,uVar15);
                        iVar11 = N_VConstrMask(*(undefined8 *)((long)ida_mem + 0x1b8),
                                               *(undefined8 *)((long)ida_mem + 0x1e8),uVar4);
                        dVar25 = 1.0;
                        if (iVar11 == 0) {
                          N_VProd(uVar4,*(undefined8 *)((long)ida_mem + 0x1a8),
                                  *(undefined8 *)((long)ida_mem + 0x200));
                          dVar25 = (double)N_VMinQuotient(*(undefined8 *)((long)ida_mem + 0x210),
                                                          *(undefined8 *)((long)ida_mem + 0x200));
                          dVar25 = dVar25 * 0.99;
                          dVar20 = dVar23 * dVar25;
                          if (dVar20 <= *(double *)((long)ida_mem + 0x248)) {
                            iVar9 = 2;
                            goto LAB_00110305;
                          }
                          uVar4 = *(undefined8 *)((long)ida_mem + 0x1a8);
                          N_VScale(uVar4,uVar4);
                        }
                      }
                      dVar1 = *(double *)((long)ida_mem + 0x248);
                      if (*(int *)((long)ida_mem + 0x220) == 2) {
                        N_VScale(*(undefined8 *)((long)ida_mem + 0x218),
                                 *(undefined8 *)((long)ida_mem + 0x1f0));
                      }
                      iVar11 = 0;
                      if (*(int *)((long)ida_mem + 0x23c) == 0) {
LAB_001102f2:
                        bVar6 = false;
                        iVar9 = 3;
                        goto LAB_00110308;
                      }
                      dVar26 = 1.0;
                      while( true ) {
                        puVar14 = (undefined8 *)((long)ida_mem + 0x1a8);
                        if (*(int *)((long)ida_mem + 0x220) == 1) {
                          N_VProd(*(undefined8 *)((long)ida_mem + 0x1b0),
                                  *(undefined8 *)((long)ida_mem + 0x1a8),
                                  *(undefined8 *)((long)ida_mem + 0x200));
                          N_VLinearSum(0x3ff0000000000000,
                                       -*(double *)((long)ida_mem + 0x2b8) * dVar26,
                                       *(undefined8 *)((long)ida_mem + 0x218),
                                       *(undefined8 *)((long)ida_mem + 0x200),
                                       *(undefined8 *)((long)ida_mem + 0x1f0));
                          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                                       *(undefined8 *)((long)ida_mem + 0x1a8),
                                       *(undefined8 *)((long)ida_mem + 0x200));
                          puVar14 = (undefined8 *)((long)ida_mem + 0x200);
                        }
                        N_VLinearSum(0x3ff0000000000000,-dVar26,
                                     *(undefined8 *)((long)ida_mem + 0x210),*puVar14,
                                     *(undefined8 *)((long)ida_mem + 0x1e8));
                        iVar12 = (**(code **)((long)ida_mem + 0x10))
                                           (*(undefined8 *)((long)ida_mem + 0x208),
                                            *(undefined8 *)((long)ida_mem + 0x1e8),
                                            *(undefined8 *)((long)ida_mem + 0x1f0),
                                            *(undefined8 *)((long)ida_mem + 0x1f8),
                                            *(undefined8 *)((long)ida_mem + 0x18));
                        *(long *)((long)ida_mem + 0x368) = *(long *)((long)ida_mem + 0x368) + 1;
                        if (iVar12 < 0) {
                          iVar9 = -8;
                          goto LAB_0011040f;
                        }
                        if (iVar12 != 0) goto LAB_00110305;
                        N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f8),
                                 *(undefined8 *)((long)ida_mem + 0x1c0));
                        iVar12 = (**(code **)((long)ida_mem + 0x400))
                                           (ida_mem,*(undefined8 *)((long)ida_mem + 0x1f8),
                                            *(undefined8 *)((long)ida_mem + 0x180),
                                            *(undefined8 *)((long)ida_mem + 0x1e8),
                                            *(undefined8 *)((long)ida_mem + 0x1f0),
                                            *(undefined8 *)((long)ida_mem + 0x1c0));
                        if (iVar12 < 0) goto LAB_00110403;
                        if (iVar12 != 0) goto LAB_00110305;
                        dVar27 = IDAWrmsNorm((IDAMem)ida_mem,*(N_Vector *)((long)ida_mem + 0x1f8),
                                             *(N_Vector *)((long)ida_mem + 0x180),0);
                        if (*(int *)((long)ida_mem + 0x238) == 0) {
                          dVar27 = dVar27 * ABS(*(double *)((long)ida_mem + 0x2b8)) *
                                            *(double *)((long)ida_mem + 0x250);
                        }
                        if ((*(int *)((long)ida_mem + 0x224) != 0) ||
                           (dVar27 * dVar27 * 0.5 <=
                            dVar24 * -2.0 * dVar25 * 0.0001 * dVar26 + dVar24)) break;
                        if (dVar26 < dVar1 / dVar20) goto LAB_001102f2;
                        *(int *)((long)ida_mem + 0x234) = *(int *)((long)ida_mem + 0x234) + 1;
                        dVar26 = dVar26 * 0.5;
                        iVar11 = iVar11 + 1;
                        if (iVar11 == *(int *)((long)ida_mem + 0x23c)) goto LAB_001102f2;
                      }
                      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1e8),
                               *(undefined8 *)((long)ida_mem + 0x210));
                      if (*(int *)((long)ida_mem + 0x220) == 1) {
                        N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f0),
                                 *(undefined8 *)((long)ida_mem + 0x218));
                      }
                      if (dVar27 <= *(double *)((long)ida_mem + 0x2e8)) goto LAB_001103a7;
                      N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x1f8),
                               *(undefined8 *)((long)ida_mem + 0x1a8));
                      iVar10 = iVar10 + 1;
                    } while (iVar10 < *(int *)((long)ida_mem + 0x230));
                    if ((sVar21 * 0.1 <= dVar27) && (0.9 < dVar27 / dVar23)) {
                      bVar6 = false;
                      iVar9 = 4;
                      break;
                    }
                  }
                  iVar9 = 5;
                  bVar6 = true;
                  if (*(long *)((long)ida_mem + 0x3f8) == 0) break;
                  N_VScale(*(undefined8 *)((long)ida_mem + 0x1c0),
                           *(undefined8 *)((long)ida_mem + 0x1a8));
                  bVar5 = iVar8 < *(int *)((long)ida_mem + 0x22c);
                  iVar8 = iVar8 + 1;
                } while (bVar5);
LAB_00110308:
                *(long *)((long)ida_mem + 0x370) = *(long *)((long)ida_mem + 0x370) + 1;
                if (local_9c == iVar7) goto LAB_00110416;
                if (!bVar6) {
                  N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x60),
                           *(undefined8 *)((long)ida_mem + 0x210));
                  N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x68),
                           *(undefined8 *)((long)ida_mem + 0x218));
                }
                local_98 = local_98 * 0.1;
                *(double *)((long)ida_mem + 0x2b8) = 1.0 / local_98;
                *(double *)((long)ida_mem + 0x290) = local_98;
                local_9c = local_9c + 1;
              } while( true );
            }
LAB_001103a7:
            iVar8 = (**(code **)((long)ida_mem + 0x48))
                              (*(undefined8 *)((long)ida_mem + 0x210),
                               *(undefined8 *)((long)ida_mem + 0x180),
                               *(undefined8 *)((long)ida_mem + 0x50));
            if (iVar8 != 0) {
              iVar9 = -0x18;
              goto LAB_00110416;
            }
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x210),
                     *(undefined8 *)((long)ida_mem + 0x60));
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)ida_mem + 0x218),
                     *(undefined8 *)((long)ida_mem + 0x68));
            iVar16 = iVar16 + 1;
            if (iVar16 == 3) {
              iVar9 = 0;
LAB_00110416:
              N_VDestroy(*(undefined8 *)((long)ida_mem + 0x210));
              N_VDestroy(*(undefined8 *)((long)ida_mem + 0x218));
              if (icopt == 1) {
                *(double *)((long)ida_mem + 0x298) = local_98;
              }
              if (iVar9 == 0) {
                return 0;
              }
              iVar7 = IDAICFailFlag((IDAMem)ida_mem,iVar9);
              return iVar7;
            }
          } while( true );
        }
        msgfmt = "tout1 too close to t0 to attempt initial condition calculation.";
        iVar8 = -0x16;
        iVar7 = 0xa6;
      }
    }
  }
LAB_0010f97a:
  IDAProcessError((IDAMem)ida_mem,iVar8,iVar7,"IDACalcIC",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ic.c"
                  ,msgfmt);
  return iVar16;
}

Assistant:

int IDACalcIC(void* ida_mem, int icopt, sunrealtype tout1)
{
  int ewtsetOK;
  int ier, nwt, nh, mxnh, icret, retval = 0;
  sunrealtype tdist, troundoff, minid, hic, ypnorm;
  IDAMem IDA_mem;

  /* Check if IDA memory exists */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if problem was malloc'ed */

  if (IDA_mem->ida_MallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_MALLOC);
  }

  /* Check inputs to IDA for correctness and consistency */

  ier = IDAInitialSetup(IDA_mem);
  if (ier != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_SetupDone = SUNTRUE;

  /* Check legality of input arguments, and set IDA memory copies. */

  if (icopt != IDA_YA_YDP_INIT && icopt != IDA_Y_INIT)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_BAD_ICOPT);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }
  IDA_mem->ida_icopt = icopt;

  if (icopt == IDA_YA_YDP_INIT && (IDA_mem->ida_id == NULL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_MISSING_ID);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  tdist     = SUNRabs(tout1 - IDA_mem->ida_tn);
  troundoff = TWO * IDA_mem->ida_uround *
              (SUNRabs(IDA_mem->ida_tn) + SUNRabs(tout1));
  if (tdist < troundoff)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_IC_TOO_CLOSE);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Allocate space and initialize temporary vectors */

  IDA_mem->ida_yy0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_yp0 = N_VClone(IDA_mem->ida_ee);
  IDA_mem->ida_t0  = IDA_mem->ida_tn;
  N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
  N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);

  /* For use in the IDA_YA_YP_INIT case, set sysindex and tscale. */

  IDA_mem->ida_sysindex = 1;
  IDA_mem->ida_tscale   = tdist;
  if (icopt == IDA_YA_YDP_INIT)
  {
    minid = N_VMin(IDA_mem->ida_id);
    if (minid < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_IC_BAD_ID);
      SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
      return (IDA_ILL_INPUT);
    }
    if (minid > HALF) { IDA_mem->ida_sysindex = 0; }
  }

  /* Set the test constant in the Newton convergence test */

  IDA_mem->ida_epsNewt = IDA_mem->ida_epiccon;

  /* Initializations:
     cjratio = 1 (for use in direct linear solvers);
     set nbacktr = 0; */

  IDA_mem->ida_cjratio = ONE;
  IDA_mem->ida_nbacktr = 0;

  /* Set hic, hh, cj, and mxnh. */

  hic    = PT001 * tdist;
  ypnorm = IDAWrmsNorm(IDA_mem, IDA_mem->ida_yp0, IDA_mem->ida_ewt,
                       IDA_mem->ida_suppressalg);
  if (ypnorm > HALF / hic) { hic = HALF / ypnorm; }
  if (tout1 < IDA_mem->ida_tn) { hic = -hic; }
  IDA_mem->ida_hh = hic;
  if (icopt == IDA_YA_YDP_INIT)
  {
    IDA_mem->ida_cj = ONE / hic;
    mxnh            = IDA_mem->ida_maxnh;
  }
  else
  {
    IDA_mem->ida_cj = ZERO;
    mxnh            = 1;
  }

  /* Loop over nwt = number of evaluations of ewt vector. */

  for (nwt = 1; nwt <= 2; nwt++)
  {
    /* Loop over nh = number of h values. */
    for (nh = 1; nh <= mxnh; nh++)
    {
      /* Call the IC nonlinear solver function. */
      retval = IDAnlsIC(IDA_mem);

      /* Cut h and loop on recoverable IDA_YA_YDP_INIT failure; else break. */
      if (retval == IDA_SUCCESS) { break; }
      IDA_mem->ida_ncfn++;
      if (retval < 0) { break; }
      if (nh == mxnh) { break; }
      /* If looping to try again, reset yy0 and yp0 if not converging. */
      if (retval != IC_SLOW_CONVRG)
      {
        N_VScale(ONE, IDA_mem->ida_phi[0], IDA_mem->ida_yy0);
        N_VScale(ONE, IDA_mem->ida_phi[1], IDA_mem->ida_yp0);
      }
      hic *= PT1;
      IDA_mem->ida_cj = ONE / hic;
      IDA_mem->ida_hh = hic;
    } /* End of nh loop */

    /* Break on failure; else reset ewt, save yy0, yp0 in phi, and loop. */
    if (retval != IDA_SUCCESS) { break; }
    ewtsetOK = IDA_mem->ida_efun(IDA_mem->ida_yy0, IDA_mem->ida_ewt,
                                 IDA_mem->ida_edata);
    if (ewtsetOK != 0)
    {
      retval = IDA_BAD_EWT;
      break;
    }
    N_VScale(ONE, IDA_mem->ida_yy0, IDA_mem->ida_phi[0]);
    N_VScale(ONE, IDA_mem->ida_yp0, IDA_mem->ida_phi[1]);

  } /* End of nwt loop */

  /* Free temporary space */

  N_VDestroy(IDA_mem->ida_yy0);
  N_VDestroy(IDA_mem->ida_yp0);

  /* Load the optional outputs. */

  if (icopt == IDA_YA_YDP_INIT) { IDA_mem->ida_hused = hic; }

  /* On any failure, print message and return proper flag. */

  if (retval != IDA_SUCCESS)
  {
    icret = IDAICFailFlag(IDA_mem, retval);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (icret);
  }

  /* Otherwise return success flag. */

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}